

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                *tokens)

{
  size_type sVar1;
  const_reference pvVar2;
  bool local_71;
  ulong local_60;
  size_t i;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string doubleDash;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  Parser *this_local;
  
  doubleDash.field_2._8_8_ = tokens;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"--",&local_41);
  std::allocator<char>::~allocator(&local_41);
  local_60 = 1;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    local_71 = false;
    if (local_60 < sVar1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,local_60);
      local_71 = std::operator!=(pvVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_40);
    }
    if (local_71 == false) break;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,local_60);
    parseIntoTokens(this,pvVar2,
                    (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                     *)doubleDash.field_2._8_8_);
    local_60 = local_60 + 1;
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void parseIntoTokens( std::vector<std::string> const& args, std::vector<Token>& tokens ) {
            const std::string doubleDash = "--";
            for( std::size_t i = 1; i < args.size() && args[i] != doubleDash; ++i )
                parseIntoTokens( args[i], tokens);
        }